

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O2

void IntegrateFrequencyTable
               (BSDF *bsdf,Vector3f *wo,int sampleCount,int thetaRes,int phiRes,Float *target)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  Float FVar4;
  BSDF *bsdf_local;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  uVar1 = 0;
  bsdf_local = bsdf;
  memset(target,0,(long)(phiRes * thetaRes) << 2);
  while (uVar1 != (~(thetaRes >> 0x1f) & thetaRes)) {
    fVar3 = (float)(int)uVar1;
    uVar1 = uVar1 + 1;
    for (uVar2 = 0; (~(phiRes >> 0x1f) & phiRes) != uVar2; uVar2 = uVar2 + 1) {
      local_50._M_unused._M_object = &bsdf_local;
      local_38 = std::
                 _Function_handler<float_(float,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bsdfs_test.cpp:228:21)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<float_(float,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bsdfs_test.cpp:228:21)>
                 ::_M_manager;
      local_50._8_8_ = wo;
      FVar4 = AdaptiveSimpson2D((function<float_(float,_float)> *)&local_50,
                                (3.1415927 / (float)thetaRes) * fVar3,
                                (6.2831855 / (float)phiRes) * (float)(int)uVar2,
                                (3.1415927 / (float)thetaRes) * (float)(int)uVar1,
                                (6.2831855 / (float)phiRes) * (float)(int)(uVar2 + 1),1e-06,6);
      *target = FVar4 * (float)sampleCount;
      target = target + 1;
      std::_Function_base::~_Function_base((_Function_base *)&local_50);
    }
  }
  return;
}

Assistant:

void IntegrateFrequencyTable(const BSDF* bsdf, const Vector3f& wo, int sampleCount,
                             int thetaRes, int phiRes, Float* target) {
    memset(target, 0, thetaRes * phiRes * sizeof(Float));

    Float factorTheta = Pi / thetaRes, factorPhi = (2 * Pi) / phiRes;

    for (int i = 0; i < thetaRes; ++i) {
        for (int j = 0; j < phiRes; ++j) {
            *target++ =
                sampleCount *
                AdaptiveSimpson2D(
                    [&](Float theta, Float phi) -> Float {
                        Float cosTheta = std::cos(theta), sinTheta = std::sin(theta);
                        Float cosPhi = std::cos(phi), sinPhi = std::sin(phi);
                        Vector3f wiL(sinTheta * cosPhi, sinTheta * sinPhi, cosTheta);
                        return bsdf->PDF(wo, bsdf->LocalToRender(wiL)) * sinTheta;
                    },
                    i* factorTheta, j* factorPhi, (i + 1) * factorTheta,
                    (j + 1) * factorPhi);
        }
    }
}